

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Opnd * __thiscall IR::Instr::UnlinkDst(Instr *this)

{
  Opnd *this_00;
  Sym *this_01;
  code *pcVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  SymOpnd *pSVar4;
  undefined4 *puVar5;
  Sym *sym;
  StackSym *stackSym;
  Opnd *oldDst;
  Instr *this_local;
  
  this_00 = this->m_dst;
  sym = (Sym *)0x0;
  bVar2 = Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    pRVar3 = Opnd::AsRegOpnd(this_00);
    sym = &pRVar3->m_sym->super_Sym;
  }
  else {
    bVar2 = Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      pSVar4 = Opnd::AsSymOpnd(this_00);
      this_01 = pSVar4->m_sym;
      bVar2 = Sym::IsStackSym(this_01);
      if (bVar2) {
        sym = &Sym::AsStackSym(this_01)->super_Sym;
      }
    }
  }
  if ((sym != (Sym *)0x0) && (((ulong)sym[1]._vptr_Sym & 1) != 0)) {
    if (*(Instr **)&sym[1].m_id == this) {
      sym[1].m_id = 0;
      sym[1].m_kind = SymKindInvalid;
      *(undefined3 *)&sym[1].field_0x15 = 0;
    }
    else if (-1 < (char)this_00->field_0xb) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x8fe,"(oldDst->isFakeDst)","oldDst->isFakeDst");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if ((char)this_00->field_0xb < '\0') {
    this_00->field_0xb = this_00->field_0xb & 0x7f;
  }
  Opnd::UnUse(this_00);
  this->m_dst = (Opnd *)0x0;
  return this_00;
}

Assistant:

Opnd *
Instr::UnlinkDst()
{
    Opnd * oldDst = this->m_dst;
    StackSym *stackSym = nullptr;

    // If oldDst isSingleDef, clear instrDef

    if (oldDst->IsRegOpnd())
    {
        stackSym = oldDst->AsRegOpnd()->m_sym;
    }
    else if (oldDst->IsSymOpnd())
    {
        Sym *sym = oldDst->AsSymOpnd()->m_sym;
        if (sym->IsStackSym())
        {
            stackSym = sym->AsStackSym();
        }
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef == this)
        {
            stackSym->m_instrDef = nullptr;
        }
        else
        {
            Assert(oldDst->isFakeDst);
        }
    }
#if DBG
    if (oldDst->isFakeDst)
    {
        oldDst->isFakeDst = false;
    }
#endif

    oldDst->UnUse();
    this->m_dst = nullptr;

    return oldDst;
}